

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O2

void __thiscall CVmHashTable::add(CVmHashTable *this,CVmHashEntry *entry)

{
  uint uVar1;
  
  uVar1 = compute_hash(this,entry);
  entry->nxt_ = this->table_[uVar1];
  this->table_[uVar1] = entry;
  return;
}

Assistant:

void CVmHashTable::add(CVmHashEntry *entry)
{
    unsigned int hash;

    /* compute the hash value for this entry */
    hash = compute_hash(entry);

    /* link it into the slot for this hash value */
    entry->nxt_ = table_[hash];
    table_[hash] = entry;
}